

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uitercollationiterator.cpp
# Opt level: O3

uint32_t __thiscall
icu_63::FCDUIterCollationIterator::handleNextCE32
          (FCDUIterCollationIterator *this,UChar32 *c,UErrorCode *errorCode)

{
  short sVar1;
  State SVar2;
  uint uVar3;
  UTrie2 *pUVar4;
  UBool UVar5;
  uint uVar6;
  UChar32 UVar7;
  char16_t *pcVar8;
  uint uVar9;
  
  do {
    while (SVar2 = this->state, SVar2 == ITER_IN_FCD_SEGMENT) {
      if (this->pos != this->limit) {
        UVar7 = (*(code *)((this->super_UIterCollationIterator).iter)->next)();
        *c = UVar7;
        this->pos = this->pos + 1;
LAB_002250e1:
        pUVar4 = (this->super_UIterCollationIterator).super_CollationIterator.trie;
        return pUVar4->data32[(*c & 0x1fU) + (uint)pUVar4->index[*c >> 5] * 4];
      }
LAB_0022508a:
      switchToForward(this);
    }
    if (SVar2 != ITER_CHECK_FWD) {
      if (2 < (int)SVar2) {
        sVar1 = (this->normalized).fUnion.fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          uVar6 = (this->normalized).fUnion.fFields.fLength;
        }
        else {
          uVar6 = (int)sVar1 >> 5;
        }
        uVar3 = this->pos;
        if (uVar3 != uVar6) {
          this->pos = uVar3 + 1;
          uVar9 = 0xffff;
          if (uVar3 < uVar6) {
            if (((int)sVar1 & 2U) == 0) {
              pcVar8 = (this->normalized).fUnion.fFields.fArray;
            }
            else {
              pcVar8 = (char16_t *)((long)&(this->normalized).fUnion + 2);
            }
            uVar9 = (uint)(ushort)pcVar8[(int)uVar3];
          }
          *c = uVar9;
          goto LAB_002250e1;
        }
      }
      goto LAB_0022508a;
    }
    uVar6 = (*(code *)((this->super_UIterCollationIterator).iter)->next)();
    *c = uVar6;
    if ((int)uVar6 < 0) {
      return 0xc0;
    }
    if ((((uVar6 < 0xc0) || ((ulong)(byte)CollationFCD::tcccIndex[uVar6 >> 5] == 0)) ||
        ((*(uint *)(CollationFCD::tcccBits + (ulong)(byte)CollationFCD::tcccIndex[uVar6 >> 5] * 4)
          >> (uVar6 & 0x1f) & 1) == 0)) ||
       (((uVar6 & 0x1fff01) != 0xf01 &&
        (((uVar6 = (*(code *)((this->super_UIterCollationIterator).iter)->current)(),
          (int)uVar6 < 0x300 || ((ulong)(byte)CollationFCD::lcccIndex[uVar6 >> 5] == 0)) ||
         ((*(uint *)(CollationFCD::lcccBits + (ulong)(byte)CollationFCD::lcccIndex[uVar6 >> 5] * 4)
           >> (uVar6 & 0x1f) & 1) == 0)))))) goto LAB_002250e1;
    (*(code *)((this->super_UIterCollationIterator).iter)->previous)();
    UVar5 = nextSegment(this,errorCode);
    if (UVar5 == '\0') {
      *c = -1;
      return 0xc0;
    }
  } while( true );
}

Assistant:

uint32_t
FCDUIterCollationIterator::handleNextCE32(UChar32 &c, UErrorCode &errorCode) {
    for(;;) {
        if(state == ITER_CHECK_FWD) {
            c = iter.next(&iter);
            if(c < 0) {
                return Collation::FALLBACK_CE32;
            }
            if(CollationFCD::hasTccc(c)) {
                if(CollationFCD::maybeTibetanCompositeVowel(c) ||
                        CollationFCD::hasLccc(iter.current(&iter))) {
                    iter.previous(&iter);
                    if(!nextSegment(errorCode)) {
                        c = U_SENTINEL;
                        return Collation::FALLBACK_CE32;
                    }
                    continue;
                }
            }
            break;
        } else if(state == ITER_IN_FCD_SEGMENT && pos != limit) {
            c = iter.next(&iter);
            ++pos;
            U_ASSERT(c >= 0);
            break;
        } else if(state >= IN_NORM_ITER_AT_LIMIT && pos != normalized.length()) {
            c = normalized[pos++];
            break;
        } else {
            switchToForward();
        }
    }
    return UTRIE2_GET32_FROM_U16_SINGLE_LEAD(trie, c);
}